

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectref.hpp
# Opt level: O0

FieldRef<int> __thiscall stackjit::ClassRef::getField<int>(ClassRef *this,string *name,Type *type)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>_>
  *puVar2;
  size_type sVar3;
  Type *pTVar4;
  runtime_error *prVar5;
  BytePtr puVar6;
  size_t sVar7;
  char local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [35];
  undefined1 local_bd;
  char local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  mapped_type *local_30;
  mapped_type *fieldRef;
  Type *type_local;
  string *name_local;
  ClassRef *this_local;
  
  fieldRef = (mapped_type *)type;
  type_local = (Type *)name;
  name_local = (string *)this;
  puVar2 = ClassMetadata::fields_abi_cxx11_(this->mMetadata);
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>_>
          ::count(puVar2,name);
  if (sVar3 == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "There exists no field called \'");
    std::operator+(local_120,local_140);
    pTVar4 = ObjectRef::type(&this->mObjRef);
    Type::name_abi_cxx11_(pTVar4);
    std::operator+(local_100,local_120);
    std::operator+(local_e0,(char *)local_100);
    std::runtime_error::runtime_error(prVar5,(string *)local_e0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = ClassMetadata::fields_abi_cxx11_(this->mMetadata);
  local_30 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>_>
             ::at(puVar2,name);
  pTVar4 = Field::type(local_30);
  bVar1 = Type::operator!=(pTVar4,(Type *)fieldRef);
  if (!bVar1) {
    puVar6 = ObjectRef::dataPtr(&this->mObjRef);
    sVar7 = Field::offset(local_30);
    FieldRef<int>::FieldRef((FieldRef<int> *)&this_local,puVar6 + sVar7);
    return (FieldRef<int>)(int *)this_local;
  }
  local_bd = 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  Type::name_abi_cxx11_((Type *)fieldRef);
  std::operator+(local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "Expected field to be of type \'");
  std::operator+(local_90,local_b0);
  pTVar4 = Field::type(local_30);
  Type::name_abi_cxx11_(pTVar4);
  std::operator+(local_70,local_90);
  std::operator+(local_50,(char *)local_70);
  std::runtime_error::runtime_error(prVar5,(string *)local_50);
  local_bd = 0;
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FieldRef<T> ClassRef::getField(std::string name, const Type* type) {
		if (mMetadata.fields().count(name) > 0) {
			auto& fieldRef = mMetadata.fields().at(name);

			if (*fieldRef.type() != *type) {
				throw std::runtime_error(
					"Expected field to be of type '" + type->name() + "' but got type '" + fieldRef.type()->name() + "'.");
			}

			return FieldRef<T>(mObjRef.dataPtr() + (std::size_t)fieldRef.offset());
		} else {
			throw std::runtime_error(
				"There exists no field called '" + name + "' in the class '" + mObjRef.type()->name() + "'.");
		}
	}